

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

int cmcmd::ExecuteEchoColor
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool newline;
  int iVar1;
  FILE *pFVar2;
  unsigned_long uVar3;
  char *extraout_RDX;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar6;
  char *c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string_view value_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  int count;
  string value;
  string fName;
  string dirName;
  string progressDir;
  uint local_150;
  bool local_149;
  int local_144;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  char *local_c8;
  size_t local_c0;
  char local_b8;
  undefined7 uStack_b7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98 [2];
  pointer local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined8 local_58;
  string local_50;
  
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = '\0';
  local_88 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 2;
  if (pbVar4 == local_88) {
    return 0;
  }
  local_149 = true;
  local_150 = 0;
  newline = true;
LAB_0019c982:
  local_140.first._M_str = (pbVar4->_M_dataplus)._M_p;
  local_140.first._M_len = pbVar4->_M_string_length;
  __str._M_str = "--switch=";
  __str._M_len = 9;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_140.first,0,9,__str)
  ;
  if (iVar1 != 0) {
    local_140.first._M_str = (pbVar4->_M_dataplus)._M_p;
    local_140.first._M_len = pbVar4->_M_string_length;
    __str_00._M_str = "--progress-dir=";
    __str_00._M_len = 0xf;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_140.first,0,0xf,__str_00);
    if (iVar1 == 0) {
      std::__cxx11::string::substr((ulong)&local_140,(ulong)pbVar4);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_140);
      goto LAB_0019cbb0;
    }
    local_140.first._M_str = (pbVar4->_M_dataplus)._M_p;
    local_140.first._M_len = pbVar4->_M_string_length;
    __str_01._M_str = "--progress-num=";
    __str_01._M_len = 0xf;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_140.first,0,0xf,__str_01);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)pbVar4);
      if (iVar1 == 0) {
        local_150 = 0;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)pbVar4);
        if (iVar1 == 0) {
          local_150 = 1;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)pbVar4);
          if (iVar1 == 0) {
            local_150 = 2;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)pbVar4);
            if (iVar1 == 0) {
              local_150 = 3;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)pbVar4);
              if (iVar1 == 0) {
                local_150 = 4;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                if (iVar1 == 0) {
                  local_150 = 5;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                  if (iVar1 == 0) {
                    local_150 = 6;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                    if (iVar1 == 0) {
                      local_150 = 7;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                      if (iVar1 == 0) {
                        local_150 = 8;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                        if (iVar1 == 0) {
                          local_150 = local_150 | 0x100;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                          if (iVar1 == 0) {
                            newline = false;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)pbVar4);
                            if (iVar1 == 0) {
                              newline = true;
                            }
                            else {
                              cmSystemTools::MakefileColorEcho
                                        (local_150,(pbVar4->_M_dataplus)._M_p,newline,local_149);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0019cbcc;
    }
    if (local_c0 == 0) goto LAB_0019cbcc;
    std::__cxx11::string::substr((ulong)local_a8,(ulong)pbVar4);
    local_140.first._M_len = local_c0;
    local_140.first._M_str = local_c8;
    local_140.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_128._M_dataplus._M_p = &DAT_00000009;
    local_128._M_string_length = 0x7c64ac;
    local_128.field_2._M_allocated_capacity = 0;
    views._M_len = 2;
    views._M_array = &local_140;
    cmCatViews(&local_e8,views);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_140.first._M_len = local_e8._M_string_length;
    local_140.first._M_str = local_e8._M_dataplus._M_p;
    local_140.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_128._M_dataplus._M_p = (pointer)0xa;
    local_128._M_string_length = 0x7c64d7;
    local_128.field_2._M_allocated_capacity = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_140;
    cmCatViews(&local_80,views_00);
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pFVar2 = (FILE *)cmsys::SystemTools::Fopen(&local_108,"r");
    local_144 = 0;
    if (pFVar2 != (FILE *)0x0) {
      iVar1 = __isoc99_fscanf(pFVar2,"%i",&local_144);
      if (iVar1 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Could not read from progress file.\n",0x23);
      }
      fclose(pFVar2);
      ppbVar7 = local_a8[0];
      ppbVar6 = local_a8[0];
      do {
        if ((*(char *)ppbVar7 == ',') || (*(char *)ppbVar7 == '\0')) {
          if (ppbVar7 != ppbVar6) {
            local_80._M_dataplus._M_p = (pointer)local_e8._M_string_length;
            local_80._M_string_length = (size_type)local_e8._M_dataplus._M_p;
            local_80.field_2._M_allocated_capacity = 0;
            local_140.first._M_len = 0;
            local_140.first._M_str = (char *)0x1;
            local_140.second = &local_128;
            local_128._M_dataplus._M_p._0_1_ = 0x2f;
            local_80.field_2._8_8_ = 1;
            local_58 = 0;
            views_01._M_len = 2;
            views_01._M_array = (iterator)&local_80;
            local_60 = local_140.second;
            cmCatViews(&local_50,views_01);
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_108,(ulong)ppbVar6);
            pFVar2 = (FILE *)cmsys::SystemTools::Fopen(&local_108,"w");
            if (pFVar2 != (FILE *)0x0) {
              fwrite("empty",5,1,pFVar2);
              fclose(pFVar2);
            }
          }
          if (*(char *)ppbVar7 == '\0') goto LAB_0019cea2;
          ppbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)ppbVar7 + 1);
        }
        ppbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)ppbVar7 + 1);
      } while( true );
    }
    goto LAB_0019ceeb;
  }
  std::__cxx11::string::substr((ulong)&local_140,(ulong)pbVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_str !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    value_00._M_str = extraout_RDX;
    value_00._M_len = local_140.first._M_len;
    local_149 = cmValue::IsOn((cmValue *)local_140.first._M_str,value_00);
  }
LAB_0019cbb0:
  pbVar5 = local_140.second;
  ppbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            local_140.first._M_len;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_140.first._M_len
      != &local_140.second) goto LAB_0019cbc4;
  goto LAB_0019cbcc;
LAB_0019cea2:
  uVar3 = cmsys::Directory::GetNumberOfFilesInDirectory(&local_e8,(string *)0x0);
  if (0 < local_144) {
    fprintf(_stdout,"[%3i%%] ",(long)((int)uVar3 * 100 + -300) / (long)local_144 & 0xffffffff);
  }
LAB_0019ceeb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  pbVar5 = local_98[0];
  ppbVar6 = local_a8[0];
  if (local_a8[0] != local_98) {
LAB_0019cbc4:
    operator_delete(ppbVar6,(ulong)((long)&(pbVar5->_M_dataplus)._M_p + 1));
  }
LAB_0019cbcc:
  pbVar4 = pbVar4 + 1;
  if (pbVar4 == local_88) {
    if (local_c8 == &local_b8) {
      return 0;
    }
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    return 0;
  }
  goto LAB_0019c982;
}

Assistant:

void cmCatFile(const std::string& fileToAppend)
{
#ifdef _WIN32
  _setmode(fileno(stdin), _O_BINARY);
  _setmode(fileno(stdout), _O_BINARY);
#endif
  std::streambuf* buf = std::cin.rdbuf();
  cmsys::ifstream source;
  if (fileToAppend != "-") {
    source.open(fileToAppend.c_str(), (std::ios::binary | std::ios::in));
    buf = source.rdbuf();
  }
  std::cout << buf;
}